

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O3

void xmlCompileAttributeTest(xmlPatParserContextPtr ctxt)

{
  xmlDictPtr pxVar1;
  byte *pbVar2;
  int iVar3;
  xmlChar *value;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  xmlPatternPtr comp;
  long lVar6;
  long lVar7;
  
  pbVar2 = ctxt->cur;
  while( true ) {
    if ((0x20 < (ulong)*pbVar2) || ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0)) break;
    ctxt->cur = pbVar2 + 1;
    pbVar2 = pbVar2 + 1;
  }
  value = xmlPatScanNCName(ctxt);
  if (ctxt->error < 0) {
    return;
  }
  pxVar4 = ctxt->cur;
  if (value == (xmlChar *)0x0) {
    if (*pxVar4 != '*') {
      ctxt->error = 1;
      return;
    }
    iVar3 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_ATTR,(xmlChar *)0x0,(xmlChar *)0x0);
    if (iVar3 != 0) {
      return;
    }
    if (*ctxt->cur == '\0') {
      return;
    }
    ctxt->cur = ctxt->cur + 1;
    return;
  }
  if (*pxVar4 == ':') {
    ctxt->cur = pxVar4 + 1;
    if ((0x20 < (ulong)pxVar4[1]) || ((0x100002600U >> ((ulong)pxVar4[1] & 0x3f) & 1) == 0)) {
      pxVar4 = xmlPatScanName(ctxt);
      if ((((*value == 'x') && (value[1] == 'm')) && (value[2] == 'l')) && (value[3] == '\0')) {
        pxVar1 = ctxt->comp->dict;
        if (pxVar1 == (xmlDictPtr)0x0) {
          pxVar5 = xmlStrdup((xmlChar *)"http://www.w3.org/XML/1998/namespace");
        }
        else {
          pxVar5 = xmlDictLookup(pxVar1,(xmlChar *)"http://www.w3.org/XML/1998/namespace",-1);
        }
      }
      else {
        if (ctxt->nb_namespaces < 1) {
          lVar7 = 0;
        }
        else {
          lVar6 = 0;
          lVar7 = 0;
          do {
            iVar3 = xmlStrEqual(*(xmlChar **)((long)ctxt->namespaces + lVar6 + 8),value);
            if (iVar3 != 0) {
              pxVar1 = ctxt->comp->dict;
              pxVar5 = *(xmlChar **)((long)ctxt->namespaces + lVar6);
              if (pxVar1 == (xmlDictPtr)0x0) {
                pxVar5 = xmlStrdup(pxVar5);
              }
              else {
                pxVar5 = xmlDictLookup(pxVar1,pxVar5,-1);
              }
              goto LAB_0017276f;
            }
            lVar7 = lVar7 + 1;
            lVar6 = lVar6 + 0x10;
          } while (lVar7 < ctxt->nb_namespaces);
        }
        pxVar5 = (xmlChar *)0x0;
LAB_0017276f:
        if (ctxt->nb_namespaces <= (int)lVar7) goto LAB_0017260a;
      }
      if (ctxt->comp->dict == (xmlDictPtr)0x0) {
        (*xmlFree)(value);
      }
      if (pxVar4 == (xmlChar *)0x0) {
        if (*ctxt->cur != '*') {
          ctxt->error = 1;
          pxVar4 = (xmlChar *)0x0;
          goto LAB_0017268c;
        }
        ctxt->cur = ctxt->cur + 1;
        comp = ctxt->comp;
        pxVar4 = (xmlChar *)0x0;
      }
      else {
        comp = ctxt->comp;
      }
      iVar3 = xmlPatternAdd(ctxt,comp,XML_OP_ATTR,pxVar4,pxVar5);
      if (iVar3 == 0) {
        return;
      }
      goto LAB_0017268c;
    }
    pxVar4 = (xmlChar *)0x0;
    pxVar5 = (xmlChar *)0x0;
LAB_0017260a:
    ctxt->error = 1;
  }
  else {
    pxVar4 = (xmlChar *)0x0;
    iVar3 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_ATTR,value,(xmlChar *)0x0);
    pxVar5 = (xmlChar *)0x0;
    if (iVar3 == 0) {
      return;
    }
  }
  if (ctxt->comp->dict == (xmlDictPtr)0x0) {
    (*xmlFree)(value);
  }
LAB_0017268c:
  if ((pxVar5 != (xmlChar *)0x0) && (ctxt->comp->dict == (xmlDictPtr)0x0)) {
    (*xmlFree)(pxVar5);
  }
  if ((pxVar4 != (xmlChar *)0x0) && (ctxt->comp->dict == (xmlDictPtr)0x0)) {
    (*xmlFree)(pxVar4);
    return;
  }
  return;
}

Assistant:

static void
xmlCompileAttributeTest(xmlPatParserContextPtr ctxt) {
    xmlChar *token = NULL;
    xmlChar *name = NULL;
    xmlChar *URL = NULL;

    SKIP_BLANKS;
    name = xmlPatScanNCName(ctxt);
    if (ctxt->error < 0)
        return;
    if (name == NULL) {
	if (CUR == '*') {
	    PUSH(XML_OP_ATTR, NULL, NULL);
	    NEXT;
	} else {
	    ERROR(NULL, NULL, NULL,
		"xmlCompileAttributeTest : Name expected\n");
	    ctxt->error = 1;
	}
	return;
    }
    if (CUR == ':') {
	int i;
	xmlChar *prefix = name;

	NEXT;

	if (IS_BLANK_CH(CUR)) {
	    ERROR5(NULL, NULL, NULL, "Invalid QName.\n", NULL);
	    ctxt->error = 1;
	    goto error;
	}
	/*
	* This is a namespace match
	*/
	token = xmlPatScanName(ctxt);
	if ((prefix[0] == 'x') &&
	    (prefix[1] == 'm') &&
	    (prefix[2] == 'l') &&
	    (prefix[3] == 0))
	{
	    XML_PAT_COPY_NSNAME(ctxt, URL, XML_XML_NAMESPACE);
	} else {
	    for (i = 0;i < ctxt->nb_namespaces;i++) {
		if (xmlStrEqual(ctxt->namespaces[2 * i + 1], prefix)) {
		    XML_PAT_COPY_NSNAME(ctxt, URL, ctxt->namespaces[2 * i])
		    break;
		}
	    }
	    if (i >= ctxt->nb_namespaces) {
		ERROR5(NULL, NULL, NULL,
		    "xmlCompileAttributeTest : no namespace bound to prefix %s\n",
		    prefix);
		ctxt->error = 1;
		goto error;
	    }
	}
        XML_PAT_FREE_STRING(ctxt, name);
        name = NULL;
	if (token == NULL) {
	    if (CUR == '*') {
		NEXT;
		PUSH(XML_OP_ATTR, NULL, URL);
	    } else {
		ERROR(NULL, NULL, NULL,
		    "xmlCompileAttributeTest : Name expected\n");
		ctxt->error = 1;
		goto error;
	    }
	} else {
	    PUSH(XML_OP_ATTR, token, URL);
	}
    } else {
	PUSH(XML_OP_ATTR, name, NULL);
    }
    return;
error:
    if (name != NULL)
	XML_PAT_FREE_STRING(ctxt, name);
    if (URL != NULL)
	XML_PAT_FREE_STRING(ctxt, URL)
    if (token != NULL)
	XML_PAT_FREE_STRING(ctxt, token);
}